

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

uint gl4cts::Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(_variable_type type)

{
  TestError *this;
  uint local_10;
  uint result;
  _variable_type type_local;
  
  switch(type) {
  case VARIABLE_TYPE_DOUBLE:
    local_10 = 1;
    break;
  case VARIABLE_TYPE_DMAT2:
    local_10 = 2;
    break;
  case VARIABLE_TYPE_DMAT2X3:
    local_10 = 6;
    break;
  case VARIABLE_TYPE_DMAT2X4:
    local_10 = 8;
    break;
  case VARIABLE_TYPE_DMAT3:
    local_10 = 6;
    break;
  case VARIABLE_TYPE_DMAT3X2:
    local_10 = 4;
    break;
  case VARIABLE_TYPE_DMAT3X4:
    local_10 = 8;
    break;
  case VARIABLE_TYPE_DMAT4:
    local_10 = 8;
    break;
  case VARIABLE_TYPE_DMAT4X2:
    local_10 = 4;
    break;
  case VARIABLE_TYPE_DMAT4X3:
    local_10 = 6;
    break;
  case VARIABLE_TYPE_DVEC2:
    local_10 = 1;
    break;
  case VARIABLE_TYPE_DVEC3:
    local_10 = 2;
    break;
  case VARIABLE_TYPE_DVEC4:
    local_10 = 2;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x407);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

unsigned int Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(_variable_type type)
{
	unsigned int result = 0;

	switch (type)
	{
	case VARIABLE_TYPE_DOUBLE:
		result = 1;
		break;
	case VARIABLE_TYPE_DVEC2:
		result = 1;
		break;
	case VARIABLE_TYPE_DVEC3:
		result = 2;
		break;
	case VARIABLE_TYPE_DVEC4:
		result = 2;
		break;
	case VARIABLE_TYPE_DMAT2:
		result = 2;
		break;
	case VARIABLE_TYPE_DMAT2X3:
		result = 6;
		break;
	case VARIABLE_TYPE_DMAT2X4:
		result = 8;
		break;
	case VARIABLE_TYPE_DMAT3:
		result = 6;
		break;
	case VARIABLE_TYPE_DMAT3X2:
		result = 4;
		break;
	case VARIABLE_TYPE_DMAT3X4:
		result = 8;
		break;
	case VARIABLE_TYPE_DMAT4:
		result = 8;
		break;
	case VARIABLE_TYPE_DMAT4X2:
		result = 4;
		break;
	case VARIABLE_TYPE_DMAT4X3:
		result = 6;
		break;

	default:
	{
		TCU_FAIL("Unrecognized type");
	}
	} /* switch (type) */

	return result;
}